

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datafile.c
# Opt level: O3

int lookup_flag(char **flag_table,char *flag_name)

{
  int iVar1;
  char *__s1;
  long lVar2;
  
  __s1 = flag_table[1];
  if (__s1 != (char *)0x0) {
    lVar2 = 2;
    do {
      iVar1 = strcmp(__s1,flag_name);
      if (iVar1 == 0) {
        return (int)lVar2 + -1;
      }
      __s1 = flag_table[lVar2];
      lVar2 = lVar2 + 1;
    } while (__s1 != (char *)0x0);
  }
  return 0;
}

Assistant:

int lookup_flag(const char **flag_table, const char *flag_name) {
	int i = FLAG_START;

	while (flag_table[i] && !streq(flag_table[i], flag_name))
		i++;

	/* End of table reached without match */
	if (!flag_table[i]) i = FLAG_END;

	return i;
}